

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O1

cmValue __thiscall
cmGeneratorTarget::GetFileSuffixInternal
          (cmGeneratorTarget *this,string *config,ArtifactType artifact,string *language)

{
  size_type sVar1;
  cmMakefile *this_00;
  bool bVar2;
  TargetType TVar3;
  cmValue cVar4;
  char *__s;
  long lVar5;
  _Alloc_hider _Var6;
  ArtifactType artifact_00;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  string langSuffix;
  string local_c0;
  string local_a0;
  string local_80;
  string local_60;
  size_type local_40;
  pointer local_38;
  
  TVar3 = cmTarget::GetType(this->Target);
  if (((((TVar3 != STATIC_LIBRARY) &&
        (TVar3 = cmTarget::GetType(this->Target), TVar3 != SHARED_LIBRARY)) &&
       (TVar3 = cmTarget::GetType(this->Target), TVar3 != MODULE_LIBRARY)) &&
      (TVar3 = cmTarget::GetType(this->Target), TVar3 != EXECUTABLE)) ||
     ((artifact == ImportLibraryArtifact && (bVar2 = NeedImportLibraryName(this,config), !bVar2))))
  {
    return (cmValue)(string *)0x0;
  }
  TVar3 = cmTarget::GetType(this->Target);
  artifact_00 = artifact;
  if ((TVar3 != SHARED_LIBRARY) &&
     (TVar3 = cmTarget::GetType(this->Target), TVar3 != MODULE_LIBRARY)) {
    TVar3 = cmTarget::GetType(this->Target);
    artifact_00 = RuntimeBinaryArtifact;
    if (TVar3 == EXECUTABLE) {
      artifact_00 = artifact;
    }
  }
  if (artifact == ImportLibraryArtifact) {
    local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
    local_80.field_2._M_allocated_capacity._0_5_ = 0x524f504d49;
    local_80.field_2._M_allocated_capacity._5_3_ = 0x535f54;
    local_80.field_2._8_5_ = 0x5849464655;
    local_80._M_string_length = 0xd;
    local_80.field_2._M_local_buf[0xd] = '\0';
    cVar4 = GetProperty(this,&local_80);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_80._M_dataplus._M_p == &local_80.field_2) goto LAB_0042e152;
    lVar5 = CONCAT35(local_80.field_2._M_allocated_capacity._5_3_,
                     local_80.field_2._M_allocated_capacity._0_5_);
    _Var6._M_p = local_80._M_dataplus._M_p;
  }
  else {
    local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
    local_a0.field_2._M_allocated_capacity._0_4_ = 0x46465553;
    local_a0.field_2._M_allocated_capacity._4_2_ = 0x5849;
    local_a0._M_string_length = 6;
    local_a0.field_2._M_local_buf[6] = '\0';
    cVar4 = GetProperty(this,&local_a0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a0._M_dataplus._M_p == &local_a0.field_2) goto LAB_0042e152;
    lVar5 = CONCAT17(local_a0.field_2._M_local_buf[7],
                     CONCAT16(local_a0.field_2._M_local_buf[6],
                              CONCAT24(local_a0.field_2._M_allocated_capacity._4_2_,
                                       local_a0.field_2._M_allocated_capacity._0_4_)));
    _Var6._M_p = local_a0._M_dataplus._M_p;
  }
  operator_delete(_Var6._M_p,lVar5 + 1);
LAB_0042e152:
  if (cVar4.Value == (string *)0x0) {
    __s = cmTarget::GetSuffixVariableInternal(this->Target,artifact_00);
    sVar1 = language->_M_string_length;
    if ((__s != (char *)0x0 && sVar1 != 0) && (*__s != '\0')) {
      local_60._M_dataplus._M_p = (pointer)strlen(__s);
      local_60.field_2._M_allocated_capacity = 1;
      local_60.field_2._8_8_ = (long)"._" + 1;
      local_38 = (language->_M_dataplus)._M_p;
      views._M_len = 3;
      views._M_array = (iterator)&local_60;
      local_60._M_string_length = (size_type)__s;
      local_40 = sVar1;
      cmCatViews_abi_cxx11_(&local_c0,views);
      cVar4 = cmMakefile::GetDefinition(this->Makefile,&local_c0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
        operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
      }
    }
    if ((__s != (char *)0x0) && (cVar4.Value == (string *)0x0)) {
      this_00 = this->Makefile;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_60,__s,(allocator<char> *)&local_c0);
      cVar4 = cmMakefile::GetDefinition(this_00,&local_60);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_60._M_dataplus._M_p != &local_60.field_2) {
        operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
      }
    }
  }
  return (cmValue)cVar4.Value;
}

Assistant:

cmValue cmGeneratorTarget::GetFileSuffixInternal(
  std::string const& config, cmStateEnums::ArtifactType artifact,
  const std::string& language) const
{
  // no suffix for non-main target types.
  if (this->GetType() != cmStateEnums::STATIC_LIBRARY &&
      this->GetType() != cmStateEnums::SHARED_LIBRARY &&
      this->GetType() != cmStateEnums::MODULE_LIBRARY &&
      this->GetType() != cmStateEnums::EXECUTABLE) {
    return nullptr;
  }

  const bool isImportedLibraryArtifact =
    (artifact == cmStateEnums::ImportLibraryArtifact);

  // Return an empty suffix for the import library if this platform
  // does not support import libraries.
  if (isImportedLibraryArtifact && !this->NeedImportLibraryName(config)) {
    return nullptr;
  }

  // The implib option is only allowed for shared libraries, module
  // libraries, and executables.
  if (this->GetType() != cmStateEnums::SHARED_LIBRARY &&
      this->GetType() != cmStateEnums::MODULE_LIBRARY &&
      this->GetType() != cmStateEnums::EXECUTABLE) {
    artifact = cmStateEnums::RuntimeBinaryArtifact;
  }

  // Compute suffix value.
  cmValue targetSuffix =
    (isImportedLibraryArtifact ? this->GetProperty("IMPORT_SUFFIX")
                               : this->GetProperty("SUFFIX"));

  if (!targetSuffix) {
    const char* suffixVar = this->Target->GetSuffixVariableInternal(artifact);
    if (!language.empty() && cmNonempty(suffixVar)) {
      std::string langSuffix = cmStrCat(suffixVar, "_", language);
      targetSuffix = this->Makefile->GetDefinition(langSuffix);
    }

    // if there is no suffix on the target nor specific language
    // use the cmake definition.
    if (!targetSuffix && suffixVar) {
      targetSuffix = this->Makefile->GetDefinition(suffixVar);
    }
  }

  return targetSuffix;
}